

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O1

FString __thiscall Stat_rendertimes::GetStats(Stat_rendertimes *this)

{
  uint uVar1;
  
  if (GetStats()::buff == '\0') {
    GetStats();
  }
  uVar1 = I_FPSTime();
  if (1000 < (int)(uVar1 - GetStats::lasttime)) {
    FString::Truncate(&GetStats::buff,0);
    AppendRenderTimes(&GetStats::buff);
    GetStats::lasttime = uVar1;
  }
  FString::AttachToOther((FString *)this,&GetStats::buff);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT(rendertimes)
{
	static FString buff;
	static int lasttime=0;
	int t=I_FPSTime();
	if (t-lasttime>1000) 
	{
		buff.Truncate(0);
		AppendRenderTimes(buff);
		lasttime=t;
	}
	return buff;
}